

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_short_writes.c
# Opt level: O3

ssize_t full_write_callback(archive *a,void *client_data,void *buffer,size_t length)

{
  void *pvVar1;
  size_t __size;
  
  __size = *(long *)((long)client_data + 0x28) + length;
  pvVar1 = realloc(*(void **)((long)client_data + 0x20),__size);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L'L',(uint)(pvVar1 != (void *)0x0),"new_buf != NULL",(void *)0x0);
  *(void **)((long)client_data + 0x20) = pvVar1;
  memcpy((void *)((long)pvVar1 + *(long *)((long)client_data + 0x28)),buffer,length);
  *(size_t *)((long)client_data + 0x28) = __size;
  return length;
}

Assistant:

static ssize_t
full_write_callback(struct archive *a, void *client_data, const void *buffer, size_t length)
{
        (void)a;

        struct checker *checker = client_data;
        size_t to_write = length;
        size_t new_len = checker->fullbuf_len + to_write;
        char *new_buf = realloc(checker->fullbuf, new_len);
        assert(new_buf != NULL);

        checker->fullbuf = new_buf;
        memcpy(checker->fullbuf + checker->fullbuf_len, buffer, to_write);
        checker->fullbuf_len = new_len;

        return to_write;
}